

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode JsTTDStart(void)

{
  ScriptContext *pSVar1;
  JsrtContext *pJVar2;
  AutoNestedHandledExceptionType local_38 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  pJVar2 = JsrtContext::GetCurrent();
  if (pJVar2 == (JsrtContext *)0x0) {
    TTDAbort_unrecoverable_error("Must have valid context when starting TTD.");
  }
  pSVar1 = (((pJVar2->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  if (pSVar1->TTDRecordOrReplayModeEnabled != false) {
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_38,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    if (pSVar1->TTDRecordModeEnabled == true) {
      TTD::EventLog::DoSnapshotExtract(pSVar1->threadContext->TTDLog);
    }
    TTD::EventLog::PushMode(pSVar1->threadContext->TTDLog,CurrentlyEnabled);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_38);
    return JsNoError;
  }
  TTDAbort_unrecoverable_error("Need to create in TTD Record Mode.");
}

Assistant:

CHAKRA_API JsTTDStart()
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    JsrtContext *currentContext = JsrtContext::GetCurrent();
    JsErrorCode cCheck = CheckContext(currentContext, JSRT_MAYBE_TRUE);
    TTDAssert(cCheck == JsNoError, "Must have valid context when starting TTD.");

    Js::ScriptContext* scriptContext = currentContext->GetScriptContext();
    TTDAssert(scriptContext->IsTTDRecordOrReplayModeEnabled(), "Need to create in TTD Record Mode.");
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode
    {
        if(scriptContext->IsTTDRecordModeEnabled())
        {
            scriptContext->GetThreadContext()->TTDLog->DoSnapshotExtract();
        }

        //Want to verify that we are at top-level of dispatch
        scriptContext->GetThreadContext()->TTDLog->PushMode(TTD::TTDMode::CurrentlyEnabled);

        return JsNoError;
    });
#endif
}